

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapelinear.cpp
# Opt level: O0

void pzshape::TPZShapeLinear::TransformDerivative1d(int transid,int num,TPZFMatrix<double> *in)

{
  double dVar1;
  double *pdVar2;
  int64_t in_RDX;
  int in_ESI;
  int in_EDI;
  TPZFMatrix<double> *unaff_retaddr;
  int i;
  undefined4 local_14;
  
  if (in_EDI != 0) {
    for (local_14 = 0; local_14 < in_ESI; local_14 = local_14 + 1) {
      pdVar2 = TPZFMatrix<double>::operator()(unaff_retaddr,CONCAT44(in_EDI,in_ESI),in_RDX);
      dVar1 = *pdVar2;
      pdVar2 = TPZFMatrix<double>::operator()(unaff_retaddr,CONCAT44(in_EDI,in_ESI),in_RDX);
      *pdVar2 = -dVar1;
    }
  }
  return;
}

Assistant:

void TPZShapeLinear::TransformDerivative1d(int transid,int num,TPZFMatrix<REAL> &in) {
		
		if(transid == 0) return;
		int i;
		for(i=0;i<num;i++) in(0,i) = -in(0,i);
	}